

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

FunctionPortListSyntax * __thiscall
slang::parsing::Parser::parseFunctionPortList
          (Parser *this,bitmask<slang::parsing::detail::FunctionOptions> options)

{
  bool bVar1;
  int iVar2;
  FunctionPortBaseSyntax *pFVar3;
  undefined4 extraout_var;
  FunctionPortListSyntax *pFVar4;
  Info *extraout_RDX;
  Info *pIVar5;
  TokenKind TVar6;
  TokenKind TVar7;
  Token TVar8;
  Token TVar9;
  Token openParen;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_160;
  Info *local_150;
  undefined8 local_148;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_140;
  ulong local_130;
  undefined8 uStack_128;
  undefined8 local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (!bVar1) {
    return (FunctionPortListSyntax *)0x0;
  }
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  local_150 = TVar8.info;
  local_148 = TVar8._0_8_;
  Token::Token(&local_160);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
  if (bVar1) {
    local_160 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleFunctionPort(TVar8.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar8,CloseParenthesis,&local_160,(DiagCode)0x3d0005);
      pIVar5 = extraout_RDX;
      goto LAB_002e2615;
    }
    do {
      pIVar5 = TVar8.info;
      pFVar3 = parseFunctionPort(this,options);
      local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pFVar3;
      local_130 = CONCAT71(local_130._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_140._M_first);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      TVar6 = TVar9.kind;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
      if (TVar6 == EndOfFile || bVar1) break;
      if (TVar6 != Comma) {
        ParserBase::expect(&this->super_ParserBase,Comma);
        do {
          bVar1 = ParserBase::
                  skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleFunctionPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                            (&this->super_ParserBase,(DiagCode)0x3d0005,false);
          if (!bVar1) {
            local_160 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
            goto LAB_002e260b;
          }
          bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
        } while (!bVar1);
      }
      local_140._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_130 = local_130 & 0xffffffffffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_140._M_first);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      TVar6 = TVar9.kind;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
      if (TVar6 == EndOfFile || bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar7 = TVar8.kind;
      TVar8 = TVar9;
    } while ((pIVar5 != TVar9.info || TVar7 != TVar6) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleFunctionPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                               (&this->super_ParserBase,(DiagCode)0x3d0005,true), bVar1));
    local_160 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
LAB_002e260b:
  pIVar5 = local_160.info;
LAB_002e2615:
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar5
                    );
  local_118 = CONCAT44(extraout_var,iVar2);
  local_140._8_4_ = 3;
  local_130 = 0;
  uStack_128 = 0;
  local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006d1000;
  openParen.info = local_150;
  openParen.kind = (undefined2)local_148;
  openParen._2_1_ = local_148._2_1_;
  openParen.numFlags.raw = local_148._3_1_;
  openParen.rawLen = local_148._4_4_;
  pFVar4 = slang::syntax::SyntaxFactory::functionPortList
                     (&this->factory,openParen,
                      (SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)
                      &local_140._M_first,local_160);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pFVar4;
}

Assistant:

FunctionPortListSyntax* Parser::parseFunctionPortList(bitmask<FunctionOptions> options) {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto openParen = consume();
    Token closeParen;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleFunctionPort, isEndOfParenList>(
        buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedFunctionPort, [this, options] { return &parseFunctionPort(options); });

    return &factory.functionPortList(openParen, buffer.copy(alloc), closeParen);
}